

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cheaptrick.cc
# Opt level: O0

void sptk::world::InitializeCheapTrickOption(int fs,CheapTrickOption *option)

{
  int iVar1;
  undefined8 *in_RSI;
  CheapTrickOption *in_stack_ffffffffffffffe8;
  
  *in_RSI = 0xbfc3333333333333;
  in_RSI[1] = 0x4051c00000000000;
  iVar1 = GetFFTSizeForCheapTrick((int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8);
  *(int *)(in_RSI + 2) = iVar1;
  return;
}

Assistant:

void InitializeCheapTrickOption(int fs, CheapTrickOption *option) {
  // q1 is the parameter used for the spectral recovery.
  // Since The parameter is optimized, you don't need to change the parameter.
  option->q1 = -0.15;
  // f0_floor and fs are used to determine fft_size;
  // We strongly recommend not to change this value unless you have enough
  // knowledge of the signal processing in CheapTrick.
  option->f0_floor = world::kFloorF0;
  option->fft_size = GetFFTSizeForCheapTrick(fs, option);
}